

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_sRGB(png_structrp png_ptr,int srgb_intent)

{
  undefined8 in_RAX;
  png_byte buf [1];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (3 < srgb_intent) {
    png_warning(png_ptr,"Invalid sRGB rendering intent specified");
  }
  uStack_18 = CONCAT17((char)srgb_intent,(undefined7)uStack_18);
  png_write_complete_chunk(png_ptr,0x73524742,(png_const_bytep)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void /* PRIVATE */
png_write_sRGB(png_structrp png_ptr, int srgb_intent)
{
   png_byte buf[1];

   png_debug(1, "in png_write_sRGB");

   if (srgb_intent >= PNG_sRGB_INTENT_LAST)
      png_warning(png_ptr,
          "Invalid sRGB rendering intent specified");

   buf[0]=(png_byte)srgb_intent;
   png_write_complete_chunk(png_ptr, png_sRGB, buf, 1);
}